

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O2

void send_cb_recverr(uv_udp_send_t *req,int status)

{
  undefined8 uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == (uv_udp_send_t *)0x0) {
    pcVar3 = "((void*)0)";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar1 = 0x47;
  }
  else {
    if ((status != -0x6f) && (status != 0)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-unreachable.c"
              ,0x48,"status == 0 || status == UV_ECONNREFUSED");
      abort();
    }
    if (req->handle == &client2 || req->handle == &client) {
      send_cb_called = send_cb_called + 1;
      return;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar2 = "(uv_udp_t*)(req->handle) == &client || (uv_udp_t*)(req->handle) == &client2";
    uVar1 = 0x49;
    pcVar3 = "0";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-unreachable.c"
          ,uVar1,pcVar2,"!=",pcVar3,0,"!=",0);
  abort();
}

Assistant:

static void send_cb_recverr(uv_udp_send_t* req, int status) {
  ASSERT_PTR_NE(req, NULL);
  ASSERT(status == 0 || status == UV_ECONNREFUSED);
  CHECK_HANDLE(req->handle);
  send_cb_called++;
}